

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O3

void Curl_printable_address(Curl_addrinfo *ai,char *buf,size_t bufsize)

{
  int __af;
  long lVar1;
  
  *buf = '\0';
  __af = ai->ai_family;
  if (__af == 2) {
    lVar1 = 4;
  }
  else {
    if (__af != 10) {
      return;
    }
    lVar1 = 8;
  }
  inet_ntop(__af,ai->ai_addr->sa_data + lVar1 + -2,buf,(socklen_t)bufsize);
  return;
}

Assistant:

void Curl_printable_address(const struct Curl_addrinfo *ai, char *buf,
                            size_t bufsize)
{
  DEBUGASSERT(bufsize);
  buf[0] = 0;

  switch(ai->ai_family) {
  case AF_INET: {
    const struct sockaddr_in *sa4 = (const void *)ai->ai_addr;
    const struct in_addr *ipaddr4 = &sa4->sin_addr;
    (void)Curl_inet_ntop(ai->ai_family, (const void *)ipaddr4, buf, bufsize);
    break;
  }
#ifdef USE_IPV6
  case AF_INET6: {
    const struct sockaddr_in6 *sa6 = (const void *)ai->ai_addr;
    const struct in6_addr *ipaddr6 = &sa6->sin6_addr;
    (void)Curl_inet_ntop(ai->ai_family, (const void *)ipaddr6, buf, bufsize);
    break;
  }
#endif
  default:
    break;
  }
}